

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O1

void __thiscall
TasGrid::GridFourier::getInterpolationWeights(GridFourier *this,double *x,double *weights)

{
  long *plVar1;
  double dVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  pointer pcVar6;
  pointer pcVar7;
  complex<double> *__z;
  size_t sVar8;
  pointer piVar9;
  double *pdVar10;
  bool bVar11;
  pointer piVar12;
  undefined8 uVar13;
  int *piVar14;
  int *piVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  double *pdVar20;
  GridFourier *pGVar21;
  ulong uVar22;
  int iVar23;
  MultiIndexSet *pMVar24;
  double dVar25;
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  numerator_cache;
  complex<double> step;
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  expcache;
  vector<int,_std::allocator<int>_> p;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  index_map;
  int local_138;
  int local_134;
  undefined1 local_128 [24];
  double *local_110;
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  local_108;
  vector<int,_std::allocator<int>_> local_e8;
  long local_d0;
  GridFourier *local_c8;
  ulong local_c0;
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  local_b8;
  long local_a0;
  int *local_98 [2];
  long local_88;
  MultiIndexSet *local_80;
  double *local_78;
  double local_70;
  double local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pMVar24 = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pMVar24 = &(this->super_BaseCanonicalGrid).needed;
  }
  local_110 = x;
  generateIndexingMap(&local_60,this);
  local_80 = pMVar24;
  if (0 < (long)pMVar24->cache_num_indexes) {
    memset(weights,0,(long)pMVar24->cache_num_indexes << 3);
  }
  piVar4 = (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar15 = piVar4;
  if (piVar4 == piVar5) {
    iVar18 = 0;
  }
  else {
    while (piVar14 = piVar15, piVar4 = piVar4 + 1, piVar4 != piVar5) {
      piVar15 = piVar4;
      if (*piVar4 <= *piVar14) {
        piVar15 = piVar14;
      }
    }
    iVar18 = *piVar14;
  }
  local_c0 = (ulong)(iVar18 + 1U);
  local_c8 = this;
  local_78 = weights;
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::vector(&local_b8,(long)(int)(iVar18 + 1U),(allocator_type *)&local_108);
  if (-1 < iVar18) {
    uVar22 = 0;
    do {
      iVar18 = (local_c8->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar22];
      ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                (local_b8.
                 super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar22,(long)iVar18);
      pcVar6 = local_b8.
               super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar22].
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)pcVar6->_M_value = 0x3ff0000000000000;
      *(undefined8 *)(pcVar6->_M_value + 8) = 0;
      piVar12 = (pointer)cos(-6.283185307179586 / (double)iVar18);
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)sin(-6.283185307179586 / (double)iVar18);
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = piVar12;
      if (1 < iVar18) {
        lVar17 = 0;
        do {
          plVar1 = (long *)((local_b8.
                             super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar22].
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar17);
          local_108.
          super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
          local_108.
          super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar1[1];
          ::std::complex<double>::operator*=
                    ((complex<double> *)&local_108,(complex<double> *)&local_e8);
          plVar1 = (long *)(local_b8.
                            super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar22].
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_value + lVar17);
          *plVar1 = (long)local_108.
                          super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          plVar1[1] = (long)local_108.
                            super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
          lVar17 = lVar17 + 0x10;
        } while ((long)iVar18 * 0x10 + -0x10 != lVar17);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != local_c0);
  }
  pGVar21 = local_c8;
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::vector(&local_108,(long)(local_c8->super_BaseCanonicalGrid).num_dimensions,
           (allocator_type *)&local_e8);
  if (0 < (pGVar21->super_BaseCanonicalGrid).num_dimensions) {
    lVar17 = 0;
    do {
      ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                (local_108.
                 super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar17,
                 (long)(pGVar21->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar17] + 1);
      dVar2 = local_110[lVar17];
      dVar25 = cos(dVar2 * 6.283185307179586);
      dVar2 = sin(dVar2 * 6.283185307179586);
      pcVar6 = local_108.
               super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar17].
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(double *)pcVar6->_M_value = dVar25;
      *(double *)(pcVar6->_M_value + 8) = dVar2;
      if (0 < (pGVar21->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar17]) {
        lVar19 = 1;
        do {
          pcVar7 = local_108.
                   super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar17].
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar6 = pcVar7 + lVar19 + -1;
          uVar13 = *(undefined8 *)(pcVar6->_M_value + 8);
          pcVar7 = pcVar7 + lVar19;
          *(undefined8 *)pcVar7->_M_value = *(undefined8 *)pcVar6->_M_value;
          *(undefined8 *)(pcVar7->_M_value + 8) = uVar13;
          if (0 < (pGVar21->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar19 + -1]) {
            iVar18 = 0;
            do {
              __z = local_108.
                    super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar17].
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
              ::std::complex<double>::operator*=(__z + lVar19,__z);
              iVar18 = iVar18 + 1;
            } while (iVar18 < (pGVar21->wrapper).num_points.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar19 + -1]);
          }
          bVar11 = lVar19 < (pGVar21->max_levels).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar17];
          lVar19 = lVar19 + 1;
        } while (bVar11);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (pGVar21->super_BaseCanonicalGrid).num_dimensions);
  }
  if (0 < (pGVar21->active_tensors).cache_num_indexes) {
    lVar17 = 0;
    local_d0 = 0;
    do {
      sVar8 = (pGVar21->active_tensors).num_dimensions;
      piVar12 = (pGVar21->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_e8,(long)(pGVar21->super_BaseCanonicalGrid).num_dimensions,
                 (allocator_type *)local_98);
      iVar18 = (pGVar21->super_BaseCanonicalGrid).num_dimensions;
      if (iVar18 < 1) {
        local_138 = 1;
      }
      else {
        piVar9 = (pGVar21->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        local_138 = 1;
        lVar19 = 0;
        do {
          iVar18 = piVar9[*(int *)((long)piVar12 + lVar19 * 4 + sVar8 * lVar17)];
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar19] = iVar18;
          local_138 = local_138 * iVar18;
          lVar19 = lVar19 + 1;
          iVar18 = (pGVar21->super_BaseCanonicalGrid).num_dimensions;
        } while (lVar19 < iVar18);
      }
      local_a0 = lVar17;
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_98,(long)iVar18,
                 (allocator_type *)local_128);
      if (0 < local_138) {
        local_70 = (double)(pGVar21->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start[local_d0] / (double)local_138;
        pdVar20 = (double *)((long)piVar12 + sVar8 * local_a0);
        local_134 = 0;
        local_110 = pdVar20;
        do {
          dVar2 = 1.0;
          lVar17 = (long)(pGVar21->super_BaseCanonicalGrid).num_dimensions;
          if (0 < lVar17) {
            lVar19 = lVar17 + 1;
            dVar2 = 1.0;
            iVar18 = local_134;
            lVar17 = lVar17 * 6;
            do {
              iVar3 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar19 + -2];
              pdVar10 = *(double **)
                         ((long)&local_108.
                                 super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].
                                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar17 * 4);
              uVar22 = (ulong)(iVar18 % iVar3);
              local_128._0_8_ = *pdVar10;
              local_128._8_8_ = pdVar10[1];
              local_c0 = uVar22;
              ::std::complex<double>::operator*=
                        ((complex<double> *)local_128,
                         local_b8.
                         super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)pdVar20 + lVar19 * 4 + -8)].
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar22);
              pdVar20 = local_110;
              if (1e-12 <= ABS(1.0 - (double)local_128._0_8_)) {
                iVar23 = (iVar18 % iVar3) * (iVar3 + 1);
                lVar16 = (long)*(int *)((long)local_110 + lVar19 * 4 + -8);
                pdVar10 = (double *)
                          (*(long *)((long)&local_108.
                                            super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].
                                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar17 * 4)
                          + lVar16 * 0x10);
                local_128._0_8_ = *pdVar10;
                local_128._8_8_ = pdVar10[1];
                ::std::complex<double>::operator*=
                          ((complex<double> *)local_128,
                           local_b8.
                           super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar16].
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                           (int)(CONCAT44(iVar23 - (iVar23 >> 0x1f) >> 0x1f,iVar23 / 2) %
                                (long)iVar3));
                local_48 = (undefined4)local_128._8_8_;
                local_68 = 1.0 - (double)local_128._0_8_;
                uStack_44 = SUB84(local_128._8_8_,4) ^ 0x80000000;
                uStack_40 = 0;
                uStack_3c = 0x80000000;
                pdVar10 = *(double **)
                           ((long)&local_108.
                                   super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].
                                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar17 * 4);
                local_128._0_8_ = *pdVar10;
                local_128._8_8_ = pdVar10[1];
                ::std::complex<double>::operator*=
                          ((complex<double> *)local_128,
                           local_b8.
                           super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start
                           [*(int *)((long)pdVar20 + lVar19 * 4 + -8)].
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar22);
                dVar25 = (double)__divdc3(SUB84(local_68,0),local_48,1.0 - (double)local_128._0_8_,
                                          -(double)local_128._8_8_);
                dVar25 = dVar25 + dVar25 + -1.0;
              }
              else {
                dVar25 = (double)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar19 + -2];
              }
              dVar2 = dVar2 * dVar25;
              local_98[0][lVar19 + -2] =
                   local_60.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(int *)((long)pdVar20 + lVar19 * 4 + -8)].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_c0];
              iVar18 = iVar18 / local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar19 + -2];
              lVar19 = lVar19 + -1;
              lVar17 = lVar17 + -6;
            } while (1 < lVar19);
          }
          iVar18 = MultiIndexSet::getSlot(local_80,local_98[0]);
          local_78[iVar18] = dVar2 * local_70 + local_78[iVar18];
          local_134 = local_134 + 1;
          pGVar21 = local_c8;
        } while (local_134 != local_138);
      }
      if (local_98[0] != (int *)0x0) {
        operator_delete(local_98[0],local_88 - (long)local_98[0]);
      }
      lVar17 = local_a0;
      if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_d0 = local_d0 + 1;
      lVar17 = lVar17 + 4;
    } while (local_d0 < (pGVar21->active_tensors).cache_num_indexes);
  }
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::~vector(&local_108);
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::~vector(&local_b8);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void GridFourier::getInterpolationWeights(const double x[], double weights[]) const {
    // if Fourier coefficient are c, Data from the target function is f, and values of the basis functions are b
    // then we have c = A * f (where A is both the Fourier transform and the reindexing)
    // and the value of the interpolant is result = <c, b> = <A f, b> = <f, A^* b>, where A^* is conjugate transpose
    // However, we consider only the real values (the complex ones add-up to zero), thus we really need A^T (regular transpose)
    // The Fourier transform is symmetric with respect to regular transpose, which leaves only the indexing
    // Take the basis functions, reindex and reorder to a data strucutre, take FFT, reindex and reorder into the weights
    //
    //
    // This code uses a O(N) algorithm instead of an O(N log N) FFT. On a 1D tensor with N=3^l points, we must compute the
    // Fourier transform of
    //      {x_n} = e^(2 \pi i x * {0,1,2, ..., (N-1)/2, -(N-1)/2, ..., -2, -1}).           (componentwise operations)
    // The FFT is
    //      X[m] = \sum_{j=0}^{N-1} e^{-2 \pi i j m / N} x_n
    //           = ( \sum_{j=0}^{(N-1)/2} e^{-2 \pi i j m / N} e^{2 \pi i x j} )
    //                + ( \sum_{j=1}^{(N-1)/2} e^{2 \pi i j m / N} e^{-2 \pi i x j} )
    //           = 2 * Re[ \sum_{j=0}^{(N-1)/2} e^{-2 \pi i j m / N} e^{2 \pi i x j} ] - 1
    //           = 2 * Re[ \sum_{j=0}^{(N-1)/2} (e^{2 \pi i (x-m/N)})^j ] - 1
    //           = 2 * Re[ \frac{1 - e^{2 \pi i (x-m/N) (N+1)/2}}{1 - e^{2 \pi i (x-m/N)}} ] - 1
    // The cost is mainly driven by evaluating the complex exponentials, so we compute what we can at the beginning and
    // park it in a cache.

    const MultiIndexSet &work = (points.empty()) ? needed : points;
    std::vector<std::vector<int>> index_map = generateIndexingMap();

    std::fill_n(weights, work.getNumIndexes(), 0.0);

    // compute what we need for e^{-2 \pi i m / N}
    int maxl = active_tensors.getMaxIndex() + 1;
    std::vector<std::vector<std::complex<double>>> expcache(maxl);
    for(int i=0; i<maxl; i++){
        int num_oned_points = wrapper.getNumPoints(i);
        expcache[i].resize(num_oned_points);
        expcache[i][0] = std::complex<double>(1.0, 0.0);
        double theta = -2.0 * Maths::pi / ((double) num_oned_points);       // step angle
        std::complex<double> step(std::cos(theta), std::sin(theta));
        for(int j=1; j<num_oned_points; j++) expcache[i][j] = expcache[i][j-1] * step;
    }

    // compute what we need for e^{2 \pi i x (N+1)/2}
    std::vector<std::vector<std::complex<double>>> numerator_cache(num_dimensions);
    for(int k=0; k<num_dimensions; k++){
        numerator_cache[k].resize(max_levels[k]+1);
        double theta = 2.0 * Maths::pi * x[k];
        numerator_cache[k][0] = std::complex<double>(std::cos(theta), std::sin(theta));
        for(int j=1; j<max_levels[k]+1; j++){
            numerator_cache[k][j] = numerator_cache[k][j-1];
            for(int i=0; i<wrapper.getNumPoints(j-1); i++) numerator_cache[k][j] *= numerator_cache[k][0];
        }
    }

    for(int n=0; n<active_tensors.getNumIndexes(); n++){
        const int *levels = active_tensors.getIndex(n);
        int num_tensor_points = 1;
        std::vector<int> num_oned_points(num_dimensions);
        for(int j=0; j<num_dimensions; j++){
            num_oned_points[j] = wrapper.getNumPoints(levels[j]);
            num_tensor_points *= num_oned_points[j];
        }
        std::vector<int> p(num_dimensions);

        double tensorw = ((double) active_w[n]) / ((double) num_tensor_points);
        for(int i=0; i<num_tensor_points; i++){
            // We interpret this "i" as running through the spatial indexing; convert to internal
            int t=i;
            double fftprod = 1.0;
            for(int j=num_dimensions-1; j>=0; j--){ // here p is the index of the spacial point in Tasmanian indexing
                int r = t % num_oned_points[j];
                int offset = (r*(num_oned_points[j]+1)/2) % num_oned_points[j];     // in order to fetch reduced form of (N+1)*r/(2*N)

                if (std::abs(1.0 - (numerator_cache[j][0] * expcache[levels[j]][r]).real()) <  Maths::num_tol){
                    // we're evaluating the basis functions at a node; take care of zero-divide
                    fftprod *= num_oned_points[j];
                }else{
                    fftprod *= 2.0 * ( (1.0 - numerator_cache[j][levels[j]] * expcache[levels[j]][offset])
                                / (1.0 - numerator_cache[j][0] * expcache[levels[j]][r]) ).real() - 1.0;
                }

                p[j] = index_map[levels[j]][r];
                t /= num_oned_points[j];
            }
            weights[work.getSlot(p)] += (tensorw * fftprod);
        }
    }
}